

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_cluster_server_handler(cluster_pr_s *pr)

{
  uintptr_t *puVar1;
  size_t sVar2;
  char *pcVar3;
  fio_msg_internal_s *pfVar4;
  ulong uVar5;
  fio_str_s key;
  fio_str_s key_00;
  fio_str_s key_01;
  fio_str_s key_02;
  subscribe_args_s args;
  subscribe_args_s args_00;
  uint64_t uVar6;
  subscription_s *psVar7;
  long lVar8;
  fio_collection_s *pfVar9;
  subscription_s **old;
  subscription_s **old_00;
  size_t *psVar10;
  size_t *psVar11;
  size_t in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef8 [24];
  fio_lock_i ret;
  size_t local_b0 [3];
  char *local_98;
  ulong local_90;
  code *local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  size_t local_68 [3];
  char *local_50;
  undefined8 local_48;
  code *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  switch(pr->type) {
  case 0:
  case 1:
    pfVar4 = pr->msg;
    LOCK();
    puVar1 = &pfVar4->ref;
    *puVar1 = *puVar1 + 1;
    UNLOCK();
    fio_cluster_server_sender(pfVar4,pr->uuid);
    break;
  case 2:
    break;
  case 3:
    pr->type = 1;
    break;
  case 4:
    local_68[0]._0_4_ = 0;
    pfVar4 = pr->msg;
    local_50 = (pfVar4->channel).data;
    local_68[1] = (pfVar4->channel).capa;
    local_68[2] = (pfVar4->channel).len;
    local_48 = 0;
    local_40 = fio_mock_on_message;
    local_38 = 0;
    uStack_30 = 0;
    local_28 = 0;
    psVar10 = local_68;
    psVar11 = (size_t *)&stack0xfffffffffffffec8;
    for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
      *psVar11 = *psVar10;
      psVar10 = psVar10 + 1;
      psVar11 = psVar11 + 1;
    }
    args.channel.capa = in_stack_fffffffffffffed0;
    args._0_8_ = in_stack_fffffffffffffec8;
    args.channel.len = in_stack_fffffffffffffed8;
    args.channel.data = (char *)in_stack_fffffffffffffee0;
    args.match = (fio_match_fn)in_stack_fffffffffffffee8;
    args.on_message = (_func_void_fio_msg_s_ptr *)in_stack_fffffffffffffef0;
    args.on_unsubscribe = (_func_void_void_ptr_void_ptr *)in_stack_fffffffffffffef8._0_8_;
    args.udata1 = (void *)in_stack_fffffffffffffef8._8_8_;
    args.udata2 = (void *)in_stack_fffffffffffffef8._16_8_;
    psVar7 = fio_subscribe(args);
    sVar2 = (pr->msg->channel).len;
    pcVar3 = (pr->msg->channel).data;
    fio_lock(&pr->lock);
    pfVar9 = &fio_postoffice.pubsub;
    uVar6 = fio_siphash13((pr->msg->channel).data,(pr->msg->channel).len,0x17fb68,0x17fb68);
    key.len = sVar2;
    key.ref = 0;
    key.small = 0;
    key.frozen = 0;
    key.reserved[0] = 0;
    key.reserved[1] = 0;
    key.reserved[2] = 0;
    key.reserved[3] = 0;
    key.reserved[4] = 0;
    key.reserved[5] = 0;
    key.reserved[6] = 0;
    key.reserved[7] = 0;
    key.reserved[8] = 0;
    key.reserved[9] = 0;
    key.capa = 0;
    key.dealloc = fio_free;
    key.data = pcVar3;
    fio_sub_hash_insert(&pr->pubsub,uVar6,key,psVar7,(subscription_s **)pfVar9);
    goto LAB_00137376;
  case 5:
    sVar2 = (pr->msg->channel).len;
    pcVar3 = (pr->msg->channel).data;
    fio_lock(&pr->lock);
    uVar6 = fio_siphash13((pr->msg->channel).data,(pr->msg->channel).len,0x17fb68,0x17fb68);
    key_01.len = sVar2;
    key_01.ref = 0;
    key_01.small = 0;
    key_01.frozen = 0;
    key_01.reserved[0] = 0;
    key_01.reserved[1] = 0;
    key_01.reserved[2] = 0;
    key_01.reserved[3] = 0;
    key_01.reserved[4] = 0;
    key_01.reserved[5] = 0;
    key_01.reserved[6] = 0;
    key_01.reserved[7] = 0;
    key_01.reserved[8] = 0;
    key_01.reserved[9] = 0;
    key_01.capa = 0;
    key_01.dealloc = fio_free;
    key_01.data = pcVar3;
    fio_sub_hash_remove(&pr->pubsub,uVar6,key_01,old_00);
    goto LAB_00137283;
  case 6:
    pfVar4 = pr->msg;
    uVar5 = *(ulong *)(pfVar4->data).data;
    local_b0[0]._0_4_ = 0;
    local_b0[1] = (pfVar4->channel).capa;
    local_b0[2] = (pfVar4->channel).len;
    local_98 = (pfVar4->channel).data;
    local_90 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18
               | (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 |
               (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
    local_88 = fio_mock_on_message;
    local_80 = 0;
    uStack_78 = 0;
    local_70 = 0;
    psVar10 = local_b0;
    psVar11 = (size_t *)&stack0xfffffffffffffec8;
    for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
      *psVar11 = *psVar10;
      psVar10 = psVar10 + 1;
      psVar11 = psVar11 + 1;
    }
    args_00.channel.capa = in_stack_fffffffffffffed0;
    args_00._0_8_ = in_stack_fffffffffffffec8;
    args_00.channel.len = in_stack_fffffffffffffed8;
    args_00.channel.data = (char *)in_stack_fffffffffffffee0;
    args_00.match = (fio_match_fn)in_stack_fffffffffffffee8;
    args_00.on_message = (_func_void_fio_msg_s_ptr *)in_stack_fffffffffffffef0;
    args_00.on_unsubscribe = (_func_void_void_ptr_void_ptr *)in_stack_fffffffffffffef8._0_8_;
    args_00.udata1 = (void *)in_stack_fffffffffffffef8._8_8_;
    args_00.udata2 = (void *)in_stack_fffffffffffffef8._16_8_;
    psVar7 = fio_subscribe(args_00);
    sVar2 = (pr->msg->channel).len;
    pcVar3 = (pr->msg->channel).data;
    fio_lock(&pr->lock);
    pfVar9 = &fio_postoffice.pubsub;
    uVar6 = fio_siphash13((pr->msg->channel).data,(pr->msg->channel).len,0x17fb68,0x17fb68);
    key_02.len = sVar2;
    key_02.ref = 0;
    key_02.small = 0;
    key_02.frozen = 0;
    key_02.reserved[0] = 0;
    key_02.reserved[1] = 0;
    key_02.reserved[2] = 0;
    key_02.reserved[3] = 0;
    key_02.reserved[4] = 0;
    key_02.reserved[5] = 0;
    key_02.reserved[6] = 0;
    key_02.reserved[7] = 0;
    key_02.reserved[8] = 0;
    key_02.reserved[9] = 0;
    key_02.capa = 0;
    key_02.dealloc = fio_free;
    key_02.data = pcVar3;
    fio_sub_hash_insert(&pr->patterns,uVar6,key_02,psVar7,(subscription_s **)pfVar9);
LAB_00137376:
    LOCK();
    pr->lock = '\0';
    UNLOCK();
switchD_00137045_default:
    return;
  case 7:
    sVar2 = (pr->msg->channel).len;
    pcVar3 = (pr->msg->channel).data;
    fio_lock(&pr->lock);
    uVar6 = fio_siphash13((pr->msg->channel).data,(pr->msg->channel).len,0x17fb68,0x17fb68);
    key_00.len = sVar2;
    key_00.ref = 0;
    key_00.small = 0;
    key_00.frozen = 0;
    key_00.reserved[0] = 0;
    key_00.reserved[1] = 0;
    key_00.reserved[2] = 0;
    key_00.reserved[3] = 0;
    key_00.reserved[4] = 0;
    key_00.reserved[5] = 0;
    key_00.reserved[6] = 0;
    key_00.reserved[7] = 0;
    key_00.reserved[8] = 0;
    key_00.reserved[9] = 0;
    key_00.capa = 0;
    key_00.dealloc = fio_free;
    key_00.data = pcVar3;
    fio_sub_hash_remove(&pr->patterns,uVar6,key_00,old);
LAB_00137283:
    LOCK();
    pr->lock = '\0';
    UNLOCK();
  default:
    goto switchD_00137045_default;
  }
  pfVar4 = pr->msg;
  LOCK();
  puVar1 = &pfVar4->ref;
  *puVar1 = *puVar1 + 1;
  UNLOCK();
  fio_publish2process(pfVar4);
  return;
}

Assistant:

static void fio_cluster_server_handler(struct cluster_pr_s *pr) {
  /* what to do? */
  // fprintf(stderr, "-");
  switch ((fio_cluster_message_type_e)pr->type) {

  case FIO_CLUSTER_MSG_FORWARD: /* fallthrough */
  case FIO_CLUSTER_MSG_JSON: {
    fio_cluster_server_sender(fio_msg_internal_dup(pr->msg), pr->uuid);
    fio_publish2process(fio_msg_internal_dup(pr->msg));
    break;
  }

  case FIO_CLUSTER_MSG_PUBSUB_SUB: {
    subscription_s *s =
        fio_subscribe(.on_message = fio_mock_on_message, .match = NULL,
                      .channel = pr->msg->channel);
    fio_str_s tmp = FIO_STR_INIT_EXISTING(
        pr->msg->channel.data, pr->msg->channel.len, 0); // don't free
    fio_lock(&pr->lock);
    fio_sub_hash_insert(&pr->pubsub,
                        FIO_HASH_FN(pr->msg->channel.data, pr->msg->channel.len,
                                    &fio_postoffice.pubsub,
                                    &fio_postoffice.pubsub),
                        tmp, s, NULL);
    fio_unlock(&pr->lock);
    break;
  }
  case FIO_CLUSTER_MSG_PUBSUB_UNSUB: {
    fio_str_s tmp = FIO_STR_INIT_EXISTING(
        pr->msg->channel.data, pr->msg->channel.len, 0); // don't free
    fio_lock(&pr->lock);
    fio_sub_hash_remove(&pr->pubsub,
                        FIO_HASH_FN(pr->msg->channel.data, pr->msg->channel.len,
                                    &fio_postoffice.pubsub,
                                    &fio_postoffice.pubsub),
                        tmp, NULL);
    fio_unlock(&pr->lock);
    break;
  }

  case FIO_CLUSTER_MSG_PATTERN_SUB: {
    uintptr_t match = fio_str2u64(pr->msg->data.data);
    subscription_s *s = fio_subscribe(.on_message = fio_mock_on_message,
                                      .match = (fio_match_fn)match,
                                      .channel = pr->msg->channel);
    fio_str_s tmp = FIO_STR_INIT_EXISTING(
        pr->msg->channel.data, pr->msg->channel.len, 0); // don't free
    fio_lock(&pr->lock);
    fio_sub_hash_insert(&pr->patterns,
                        FIO_HASH_FN(pr->msg->channel.data, pr->msg->channel.len,
                                    &fio_postoffice.pubsub,
                                    &fio_postoffice.pubsub),
                        tmp, s, NULL);
    fio_unlock(&pr->lock);
    break;
  }

  case FIO_CLUSTER_MSG_PATTERN_UNSUB: {
    fio_str_s tmp = FIO_STR_INIT_EXISTING(
        pr->msg->channel.data, pr->msg->channel.len, 0); // don't free
    fio_lock(&pr->lock);
    fio_sub_hash_remove(&pr->patterns,
                        FIO_HASH_FN(pr->msg->channel.data, pr->msg->channel.len,
                                    &fio_postoffice.pubsub,
                                    &fio_postoffice.pubsub),
                        tmp, NULL);
    fio_unlock(&pr->lock);
    break;
  }

  case FIO_CLUSTER_MSG_ROOT_JSON:
    pr->type = FIO_CLUSTER_MSG_JSON; /* fallthrough */
  case FIO_CLUSTER_MSG_ROOT:
    fio_publish2process(fio_msg_internal_dup(pr->msg));
    break;

  case FIO_CLUSTER_MSG_SHUTDOWN: /* fallthrough */
  case FIO_CLUSTER_MSG_ERROR:    /* fallthrough */
  case FIO_CLUSTER_MSG_PING:     /* fallthrough */
  default:
    break;
  }
}